

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void extend_frame(YV12_BUFFER_CONFIG *ybf,int ext_size,int num_planes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int right_1;
  int bottom_1;
  int left_1;
  int top_1;
  int is_uv_1;
  int plane_1;
  int right;
  int bottom;
  int left;
  int top;
  int is_uv;
  int plane;
  int ss_y;
  int ss_x;
  int in_stack_ffffffffffffff8c;
  int iVar6;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc0;
  undefined4 local_3c;
  int in_stack_ffffffffffffffc8;
  undefined4 local_24;
  
  iVar1 = *(int *)(in_RDI + 0x90);
  iVar2 = *(int *)(in_RDI + 0x94);
  if ((*(uint *)(in_RDI + 0xc0) & 8) == 0) {
    for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
      uVar4 = (uint)(0 < local_3c);
      iVar6 = iVar1;
      iVar3 = iVar2;
      if (uVar4 == 0) {
        iVar6 = 0;
        iVar3 = 0;
      }
      iVar5 = in_ESI >> ((byte)iVar6 & 0x1f);
      extend_plane((uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_ESI,
                   iVar3,in_ESI,iVar6,in_stack_ffffffffffffff8c,
                   (iVar5 + *(int *)(in_RDI + (long)(int)uVar4 * 4)) -
                   *(int *)(in_RDI + 0x10 + (long)(int)uVar4 * 4),iVar5,uVar4,
                   in_stack_ffffffffffffffc8);
    }
  }
  else {
    for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
      uVar4 = (uint)(0 < local_24);
      iVar6 = iVar1;
      iVar3 = iVar2;
      if (uVar4 == 0) {
        iVar6 = 0;
        iVar3 = 0;
      }
      iVar5 = in_ESI >> ((byte)iVar6 & 0x1f);
      extend_plane_high((uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_ESI,iVar3,in_ESI,iVar6,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffffc0,
                        (iVar5 + *(int *)(in_RDI + (long)(int)uVar4 * 4)) -
                        *(int *)(in_RDI + 0x10 + (long)(int)uVar4 * 4),iVar5,uVar4);
    }
  }
  return;
}

Assistant:

static void extend_frame(YV12_BUFFER_CONFIG *const ybf, int ext_size,
                         const int num_planes) {
  const int ss_x = ybf->subsampling_x;
  const int ss_y = ybf->subsampling_y;

  assert(ybf->y_height - ybf->y_crop_height < 16);
  assert(ybf->y_width - ybf->y_crop_width < 16);
  assert(ybf->y_height - ybf->y_crop_height >= 0);
  assert(ybf->y_width - ybf->y_crop_width >= 0);

#if CONFIG_AV1_HIGHBITDEPTH
  if (ybf->flags & YV12_FLAG_HIGHBITDEPTH) {
    for (int plane = 0; plane < num_planes; ++plane) {
      const int is_uv = plane > 0;
      const int top = ext_size >> (is_uv ? ss_y : 0);
      const int left = ext_size >> (is_uv ? ss_x : 0);
      const int bottom = top + ybf->heights[is_uv] - ybf->crop_heights[is_uv];
      const int right = left + ybf->widths[is_uv] - ybf->crop_widths[is_uv];
      extend_plane_high(ybf->buffers[plane], ybf->strides[is_uv],
                        ybf->crop_widths[is_uv], ybf->crop_heights[is_uv], top,
                        left, bottom, right, 0, ybf->crop_heights[is_uv]);
    }
    return;
  }
#endif

  for (int plane = 0; plane < num_planes; ++plane) {
    const int is_uv = plane > 0;
    const int top = ext_size >> (is_uv ? ss_y : 0);
    const int left = ext_size >> (is_uv ? ss_x : 0);
    const int bottom = top + ybf->heights[is_uv] - ybf->crop_heights[is_uv];
    const int right = left + ybf->widths[is_uv] - ybf->crop_widths[is_uv];
    extend_plane(ybf->buffers[plane], ybf->strides[is_uv],
                 ybf->crop_widths[is_uv], ybf->crop_heights[is_uv], top, left,
                 bottom, right, 0, ybf->crop_heights[is_uv]);
  }
}